

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcryptohash-sha1.c
# Opt level: O1

void p_crypto_hash_sha1_finish(PHashSHA1 *ctx)

{
  puint32 pVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  uint uVar6;
  
  pVar1 = ctx->len_high;
  uVar2 = ctx->len_low;
  uVar6 = uVar2 & 0x3f;
  uVar3 = (uint)(0x37 < uVar6) << 6 | 0x38;
  uVar4 = uVar3 - uVar6;
  if (uVar4 != 0 && uVar6 <= uVar3) {
    p_crypto_hash_sha1_update(ctx,pp_crypto_hash_sha1_pad,(ulong)uVar4);
  }
  (ctx->buf).buf_w[0xe] = pVar1 << 3 | uVar2 >> 0x1d;
  (ctx->buf).buf_w[0xf] = uVar2 << 3;
  lVar5 = 0;
  do {
    uVar2 = ctx->hash[lVar5 + -0x10];
    ctx->hash[lVar5 + -0x10] =
         uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
    lVar5 = lVar5 + 1;
  } while ((int)lVar5 != 0xe);
  pp_crypto_hash_sha1_process(ctx,(puint32 *)ctx);
  lVar5 = 0;
  do {
    uVar2 = ctx->hash[lVar5];
    ctx->hash[lVar5] =
         uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
    lVar5 = lVar5 + 1;
  } while ((int)lVar5 != 5);
  return;
}

Assistant:

void
p_crypto_hash_sha1_finish (PHashSHA1 *ctx)
{
	puint32	high;
	puint32	low;
	pint	left;
	pint	last;

	left = ctx->len_low & 0x3F;
	last = (left < 56) ? (56 - left) : (120 - left);

	low = ctx->len_low << 3;
	high = ctx->len_high << 3
	     | ctx->len_low >> 29;

	if (last > 0)
		p_crypto_hash_sha1_update (ctx, pp_crypto_hash_sha1_pad, (psize) last);

	ctx->buf.buf_w[14] = high;
	ctx->buf.buf_w[15] = low;

	pp_crypto_hash_sha1_swap_bytes (ctx->buf.buf_w, 14);
	pp_crypto_hash_sha1_process (ctx, ctx->buf.buf_w);

	pp_crypto_hash_sha1_swap_bytes (ctx->hash, 5);
}